

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O0

EStatusCode __thiscall PDFModifiedPage::WritePage(PDFModifiedPage *this)

{
  ObjectIDType OVar1;
  PrimitiveObjectsWriter PVar2;
  DictionaryContext *pDVar3;
  bool bVar4;
  bool bVar5;
  EPDFObjectType EVar6;
  ObjectsContext *this_00;
  IndirectObjectsReferenceRegistry *pIVar7;
  ObjectIDType inObjectID;
  PDFParser *pPVar8;
  PDFDictionary *pPVar9;
  Trace *pTVar10;
  ObjectsContext *this_01;
  key_type pPVar11;
  string *psVar12;
  mapped_type inObject;
  DocumentContext *pDVar13;
  ObjectIDTypeSet *this_02;
  size_type sVar14;
  reference puVar15;
  PDFObject *pPVar16;
  PDFIndirectObjectReference *pPVar17;
  PDFArray *pPVar18;
  value_type pPVar19;
  IByteWriter *pIVar20;
  reference inName;
  PDFObject *local_860;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_500;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f8;
  iterator it;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  PrimitiveObjectsWriter local_4a0;
  PrimitiveObjectsWriter primitivesWriter;
  PDFStream *newStream;
  undefined1 local_478 [8];
  PDFObjectCastPtr<PDFDictionary> resourceDict_1;
  ObjectReference local_458;
  undefined1 local_448 [8];
  GetObjectWriteInformationResult res;
  allocator<char> local_401;
  string local_400;
  undefined1 local_3e0 [8];
  PDFObjectCastPtr<PDFDictionary> resourceDict;
  string local_3c8;
  undefined1 local_3a8 [8];
  PDFObjectCastPtr<PDFIndirectObjectReference> resourceDictRef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  undefined1 local_368 [8];
  PDFObjectCastPtr<PDFDictionary> inheritedResources;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  PDFObjectCastPtr<PDFDictionary> parentDict;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  undefined1 local_290 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  formResourcesNames;
  ObjectIDType newResourcesIndirect;
  ObjectIDType resourcesIndirect;
  PDFObjectCastPtr<PDFIndirectObjectReference> ref_1;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> refs_1;
  PDFArray *anArray_1;
  string local_230;
  undefined1 local_210 [8];
  PDFObjectCastPtr<PDFIndirectObjectReference> ref;
  string local_1f8;
  undefined1 local_1d8 [8];
  RefCountPtr<PDFObject> pageContent;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  _Self local_168;
  _Self local_160;
  iterator it_1;
  ObjectIDTypeSet *annotations;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> refs;
  string local_130;
  undefined1 local_110 [8];
  PDFObjectCastPtr<PDFArray> anArray;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  DictionaryContext *local_88;
  DictionaryContext *modifiedPageObject;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  pageDictionaryObjectIt;
  undefined1 local_58 [8];
  PDFObjectCastPtr<PDFDictionary> pageDictionaryObject;
  ObjectIDType pageObjectID;
  ObjectIDType newEncapsulatingObjectID;
  ObjectIDType newContentObjectID;
  ObjectsContext *objectContext;
  PDFDocumentCopyingContext *copyingContext;
  EStatusCode status;
  PDFModifiedPage *this_local;
  
  copyingContext._4_4_ = EndContentContext(this);
  objectContext = (ObjectsContext *)0x0;
  if ((copyingContext._4_4_ != eSuccess) || ((this->mIsDirty & 1U) == 0)) goto LAB_0024a503;
  this_00 = PDFWriter::GetObjectsContext(this->mWriter);
  pIVar7 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
  inObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar7);
  pageObjectID = 0;
  objectContext = (ObjectsContext *)PDFWriter::CreatePDFCopyingContextForModifiedFile(this->mWriter)
  ;
  pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                     ((PDFDocumentCopyingContext *)objectContext);
  pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue =
       (PDFDictionary *)PDFParser::GetPageObjectID(pPVar8,this->mPageIndex);
  pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                     ((PDFDocumentCopyingContext *)objectContext);
  pPVar9 = PDFParser::ParsePage(pPVar8,this->mPageIndex);
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)local_58,&pPVar9->super_PDFObject);
  bVar4 = RefCountPtr<PDFDictionary>::operator!((RefCountPtr<PDFDictionary> *)local_58);
  if (bVar4) {
    this_local._4_4_ = eFailure;
    pageDictionaryObjectIt.
    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
    .mCurrentPosition._M_node._0_4_ = 1;
  }
  else {
    pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
    PDFDictionary::GetIterator
              ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                *)&modifiedPageObject,pPVar9);
    copyingContext._4_4_ =
         ObjectsContext::StartModifiedIndirectObject
                   (this_00,(ObjectIDType)
                            pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue);
    if (copyingContext._4_4_ == eSuccess) {
      this_01 = PDFWriter::GetObjectsContext(this->mWriter);
      local_88 = ObjectsContext::StartDictionary(this_01);
      while (bVar4 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                     ::MoveNext((ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                 *)&modifiedPageObject), bVar4) {
        pPVar11 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                  ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                            *)&modifiedPageObject);
        psVar12 = PDFName::GetValue_abi_cxx11_(pPVar11);
        bVar4 = std::operator!=(psVar12,"Resources");
        if (bVar4) {
          pPVar11 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                    ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              *)&modifiedPageObject);
          psVar12 = PDFName::GetValue_abi_cxx11_(pPVar11);
          bVar4 = std::operator!=(psVar12,"Contents");
          if (bVar4) {
            pPVar11 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                      ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                *)&modifiedPageObject);
            psVar12 = PDFName::GetValue_abi_cxx11_(pPVar11);
            bVar4 = std::operator!=(psVar12,"Annots");
            pDVar3 = local_88;
            if (bVar4) {
              pPVar11 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                  *)&modifiedPageObject);
              psVar12 = PDFName::GetValue_abi_cxx11_(pPVar11);
              DictionaryContext::WriteKey(pDVar3,psVar12);
              inObject = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                         ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                     *)&modifiedPageObject);
              PDFDocumentCopyingContext::CopyDirectObjectAsIs
                        ((PDFDocumentCopyingContext *)objectContext,inObject);
            }
          }
        }
      }
      pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Annots",&local_a9);
      bVar5 = PDFDictionary::Exists(pPVar9,&local_a8);
      bVar4 = true;
      if (!bVar5) {
        pDVar13 = PDFWriter::GetDocumentContext(this->mWriter);
        this_02 = PDFHummus::DocumentContext::GetAnnotations(pDVar13);
        sVar14 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 size(this_02);
        bVar4 = sVar14 != 0;
      }
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      pDVar3 = local_88;
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Annots",&local_d1);
        DictionaryContext::WriteKey(pDVar3,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        ObjectsContext::StartArray(this_00);
        pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"Annots",
                   (allocator<char> *)((long)&anArray.super_RefCountPtr<PDFArray>.mValue + 7));
        bVar4 = PDFDictionary::Exists(pPVar9,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&anArray.super_RefCountPtr<PDFArray>.mValue + 7));
        if (bVar4) {
          pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                             ((PDFDocumentCopyingContext *)objectContext);
          pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"Annots",
                     (allocator<char> *)
                     ((long)&refs.
                             super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                             .mCurrentPosition._M_current + 7));
          pPVar16 = PDFParser::QueryDictionaryObject(pPVar8,pPVar9,&local_130);
          PDFObjectCastPtr<PDFArray>::PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFArray> *)local_110,pPVar16);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&refs.
                             super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                             .mCurrentPosition._M_current + 7));
          pPVar18 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_110);
          PDFArray::GetIterator
                    ((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                      *)&annotations,pPVar18);
          while (bVar4 = ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                         ::MoveNext((ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                     *)&annotations), bVar4) {
            pPVar19 = SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                      ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                 *)&annotations);
            PDFDocumentCopyingContext::CopyDirectObjectAsIs
                      ((PDFDocumentCopyingContext *)objectContext,pPVar19);
          }
          PDFObjectCastPtr<PDFArray>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_110);
        }
        pDVar13 = PDFWriter::GetDocumentContext(this->mWriter);
        it_1._M_node = (_Base_ptr)PDFHummus::DocumentContext::GetAnnotations(pDVar13);
        sVar14 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)it_1._M_node);
        if (sVar14 != 0) {
          local_160._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               begin(it_1._M_node);
          while( true ) {
            local_168._M_node =
                 (_Base_ptr)
                 std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 end(it_1._M_node);
            bVar4 = std::operator!=(&local_160,&local_168);
            if (!bVar4) break;
            puVar15 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_160);
            ObjectsContext::WriteNewIndirectObjectReference(this_00,*puVar15,eTokenSeparatorSpace);
            std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_160);
          }
        }
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::clear
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   it_1._M_node);
        ObjectsContext::EndArray(this_00,eTokenSeparatorEndLine);
      }
      pDVar3 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Contents",&local_189)
      ;
      DictionaryContext::WriteKey(pDVar3,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Contents",&local_1b1)
      ;
      bVar4 = PDFDictionary::Exists(pPVar9,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        ObjectsContext::StartArray(this_00);
        if ((this->mEnsureContentEncapsulation & 1U) != 0) {
          pIVar7 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
          pageObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar7);
          ObjectsContext::WriteNewIndirectObjectReference(this_00,pageObjectID,eTokenSeparatorSpace)
          ;
        }
        pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                           ((PDFDocumentCopyingContext *)objectContext);
        pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"Contents",
                   (allocator<char> *)
                   ((long)&ref.super_RefCountPtr<PDFIndirectObjectReference>.mValue + 7));
        pPVar16 = PDFParser::QueryDictionaryObject(pPVar8,pPVar9,&local_1f8);
        RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_1d8,pPVar16);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&ref.super_RefCountPtr<PDFIndirectObjectReference>.mValue + 7));
        pPVar16 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_1d8);
        EVar6 = PDFObject::GetType(pPVar16);
        if (EVar6 == ePDFObjectStream) {
          pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,"Contents",(allocator<char> *)((long)&anArray_1 + 7));
          pPVar16 = PDFDictionary::QueryDirectObject(pPVar9,&local_230);
          PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_210,pPVar16);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator((allocator<char> *)((long)&anArray_1 + 7));
          pPVar17 = RefCountPtr<PDFIndirectObjectReference>::operator->
                              ((RefCountPtr<PDFIndirectObjectReference> *)local_210);
          OVar1 = pPVar17->mObjectID;
          pPVar17 = RefCountPtr<PDFIndirectObjectReference>::operator->
                              ((RefCountPtr<PDFIndirectObjectReference> *)local_210);
          ObjectsContext::WriteIndirectObjectReference
                    (this_00,OVar1,pPVar17->mVersion,eTokenSeparatorSpace);
          PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_210);
        }
        else {
          pPVar16 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_1d8);
          EVar6 = PDFObject::GetType(pPVar16);
          if (EVar6 == ePDFObjectArray) {
            pPVar18 = (PDFArray *)
                      RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_1d8);
            PDFArray::GetIterator
                      ((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                        *)&ref_1.super_RefCountPtr<PDFIndirectObjectReference>.mValue,pPVar18);
            PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
                      ((PDFObjectCastPtr<PDFIndirectObjectReference> *)&resourcesIndirect);
            while (bVar4 = ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                           ::MoveNext((ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                       *)&ref_1.super_RefCountPtr<PDFIndirectObjectReference>.mValue
                                     ), bVar4) {
              pPVar19 = SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                        ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                   *)&ref_1.super_RefCountPtr<PDFIndirectObjectReference>.mValue);
              PDFObjectCastPtr<PDFIndirectObjectReference>::operator=
                        ((PDFObjectCastPtr<PDFIndirectObjectReference> *)&resourcesIndirect,pPVar19)
              ;
              pPVar17 = RefCountPtr<PDFIndirectObjectReference>::operator->
                                  ((RefCountPtr<PDFIndirectObjectReference> *)&resourcesIndirect);
              OVar1 = pPVar17->mObjectID;
              pPVar17 = RefCountPtr<PDFIndirectObjectReference>::operator->
                                  ((RefCountPtr<PDFIndirectObjectReference> *)&resourcesIndirect);
              ObjectsContext::WriteIndirectObjectReference
                        (this_00,OVar1,pPVar17->mVersion,eTokenSeparatorSpace);
            }
            PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
                      ((PDFObjectCastPtr<PDFIndirectObjectReference> *)&resourcesIndirect);
          }
        }
        ObjectsContext::WriteNewIndirectObjectReference(this_00,inObjectID,eTokenSeparatorSpace);
        ObjectsContext::EndArray(this_00,eTokenSeparatorNone);
        ObjectsContext::EndLine(this_00);
        RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_1d8);
      }
      else {
        ObjectReference::ObjectReference((ObjectReference *)&pageContent.mValue,inObjectID);
        ObjectsContext::WriteIndirectObjectReference
                  (this_00,(ObjectReference *)&pageContent.mValue,eTokenSeparatorSpace);
      }
      newResourcesIndirect = 0;
      formResourcesNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_290);
      pDVar3 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"Resources",&local_2b1);
      DictionaryContext::WriteKey(pDVar3,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"Resources",
                 (allocator<char> *)((long)&parentDict.super_RefCountPtr<PDFDictionary>.mValue + 7))
      ;
      bVar4 = PDFDictionary::Exists(pPVar9,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&parentDict.super_RefCountPtr<PDFDictionary>.mValue + 7))
      ;
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"Resources",
                   (allocator<char> *)
                   ((long)&resourceDict.super_RefCountPtr<PDFDictionary>.mValue + 7));
        pPVar16 = PDFDictionary::QueryDirectObject(pPVar9,&local_3c8);
        PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_3a8,pPVar16);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&resourceDict.super_RefCountPtr<PDFDictionary>.mValue + 7));
        bVar4 = RefCountPtr<PDFIndirectObjectReference>::operator!
                          ((RefCountPtr<PDFIndirectObjectReference> *)local_3a8);
        if (bVar4) {
          pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"Resources",&local_401);
          pPVar16 = PDFDictionary::QueryDirectObject(pPVar9,&local_400);
          PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFDictionary> *)local_3e0,pPVar16);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
          pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                             ((PDFDocumentCopyingContext *)objectContext);
          pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_3e0);
          WriteModifiedResourcesDict_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&res.second.mGenerationNumber,this,pPVar8,pPVar9,this_00,
                     (PDFDocumentCopyingContext *)objectContext);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&res.second.mGenerationNumber);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&res.second.mGenerationNumber);
          PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFDictionary> *)local_3e0);
        }
        else {
          pPVar17 = RefCountPtr<PDFIndirectObjectReference>::operator->
                              ((RefCountPtr<PDFIndirectObjectReference> *)local_3a8);
          newResourcesIndirect = pPVar17->mObjectID;
          pIVar7 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
          IndirectObjectsReferenceRegistry::GetObjectWriteInformation
                    ((GetObjectWriteInformationResult *)local_448,pIVar7,newResourcesIndirect);
          pDVar3 = local_88;
          if (((local_448[0] & 1U) == 0) || ((res._1_1_ & 1) == 0)) {
            ObjectReference::ObjectReference
                      ((ObjectReference *)&resourceDict_1.super_RefCountPtr<PDFDictionary>.mValue,
                       newResourcesIndirect);
            DictionaryContext::WriteObjectReferenceValue
                      (pDVar3,(ObjectReference *)
                              &resourceDict_1.super_RefCountPtr<PDFDictionary>.mValue);
          }
          else {
            pIVar7 = ObjectsContext::GetInDirectObjectsRegistry(this_00);
            formResourcesNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar7);
            pDVar3 = local_88;
            ObjectReference::ObjectReference
                      (&local_458,
                       (ObjectIDType)
                       formResourcesNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            DictionaryContext::WriteObjectReferenceValue(pDVar3,&local_458);
          }
        }
        PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_3a8);
      }
      else {
        pPVar9 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Parent",&local_311)
        ;
        bVar4 = PDFDictionary::Exists(pPVar9,&local_310);
        if (bVar4) {
          pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                             ((PDFDocumentCopyingContext *)objectContext);
          pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_338,"Parent",&local_339);
          local_860 = PDFParser::QueryDictionaryObject(pPVar8,pPVar9,&local_338);
        }
        else {
          local_860 = (PDFObject *)0x0;
        }
        PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFDictionary> *)local_2f0,local_860);
        if (bVar4) {
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator(&local_339);
        }
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator(&local_311);
        bVar4 = RefCountPtr<PDFDictionary>::operator!((RefCountPtr<PDFDictionary> *)local_2f0);
        if (bVar4) {
          WriteNewResourcesDictionary_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&inheritedResources.super_RefCountPtr<PDFDictionary>.mValue,this,this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&inheritedResources.super_RefCountPtr<PDFDictionary>.mValue);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&inheritedResources.super_RefCountPtr<PDFDictionary>.mValue);
        }
        else {
          pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                             ((PDFDocumentCopyingContext *)objectContext);
          pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_2f0);
          pPVar16 = findInheritedResources(this,pPVar8,pPVar9);
          PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFDictionary> *)local_368,pPVar16);
          bVar4 = RefCountPtr<PDFDictionary>::operator!((RefCountPtr<PDFDictionary> *)local_368);
          if (bVar4) {
            WriteNewResourcesDictionary_abi_cxx11_(&local_380,this,this_00);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_290,&local_380);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_380);
          }
          else {
            pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                               ((PDFDocumentCopyingContext *)objectContext);
            pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_368);
            WriteModifiedResourcesDict_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&resourceDictRef.super_RefCountPtr<PDFIndirectObjectReference>.mValue,this
                       ,pPVar8,pPVar9,this_00,(PDFDocumentCopyingContext *)objectContext);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_290,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&resourceDictRef.super_RefCountPtr<PDFIndirectObjectReference>.mValue);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&resourceDictRef.super_RefCountPtr<PDFIndirectObjectReference>.mValue);
          }
          PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFDictionary> *)local_368);
        }
        PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFDictionary> *)local_2f0);
      }
      ObjectsContext::EndDictionary(this_00,local_88);
      ObjectsContext::EndIndirectObject(this_00);
      if (newResourcesIndirect == 0) {
LAB_00249dfb:
        PrimitiveObjectsWriter::PrimitiveObjectsWriter(&local_4a0,(IByteWriter *)0x0);
        if (pageObjectID == 0) {
LAB_00249ff2:
          copyingContext._4_4_ = ObjectsContext::StartNewIndirectObject(this_00,inObjectID);
          if (copyingContext._4_4_ == eSuccess) {
            primitivesWriter.mStreamForWriting =
                 (IByteWriter *)
                 ObjectsContext::StartPDFStream(this_00,(DictionaryContext *)0x0,false);
            pIVar20 = PDFStream::GetWriteStream((PDFStream *)primitivesWriter.mStreamForWriting);
            PrimitiveObjectsWriter::SetStreamForWriting(&local_4a0,pIVar20);
            if (pageObjectID != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4e8,"Q",(allocator<char> *)((long)&it._M_current + 7));
              PrimitiveObjectsWriter::WriteKeyword(&local_4a0,&local_4e8);
              std::__cxx11::string::~string((string *)&local_4e8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
            }
            local_4f8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_290);
            while( true ) {
              local_500._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_290);
              bVar4 = __gnu_cxx::operator!=(&local_4f8,&local_500);
              if (!bVar4) break;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_520,"q",&local_521);
              PrimitiveObjectsWriter::WriteKeyword(&local_4a0,&local_520);
              std::__cxx11::string::~string((string *)&local_520);
              std::allocator<char>::~allocator(&local_521);
              PrimitiveObjectsWriter::WriteInteger(&local_4a0,1,eTokenSeparatorSpace);
              PrimitiveObjectsWriter::WriteInteger(&local_4a0,0,eTokenSeparatorSpace);
              PrimitiveObjectsWriter::WriteInteger(&local_4a0,0,eTokenSeparatorSpace);
              PrimitiveObjectsWriter::WriteInteger(&local_4a0,1,eTokenSeparatorSpace);
              PrimitiveObjectsWriter::WriteInteger(&local_4a0,0,eTokenSeparatorSpace);
              PrimitiveObjectsWriter::WriteInteger(&local_4a0,0,eTokenSeparatorSpace);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_548,"cm",&local_549);
              PrimitiveObjectsWriter::WriteKeyword(&local_4a0,&local_548);
              std::__cxx11::string::~string((string *)&local_548);
              std::allocator<char>::~allocator(&local_549);
              inName = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_4f8);
              PrimitiveObjectsWriter::WriteName(&local_4a0,inName,eTokenSeparatorSpace);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_570,"Do",&local_571);
              PrimitiveObjectsWriter::WriteKeyword(&local_4a0,&local_570);
              std::__cxx11::string::~string((string *)&local_570);
              std::allocator<char>::~allocator(&local_571);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_598,"Q",&local_599);
              PrimitiveObjectsWriter::WriteKeyword(&local_4a0,&local_598);
              std::__cxx11::string::~string((string *)&local_598);
              std::allocator<char>::~allocator(&local_599);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_4f8);
            }
            copyingContext._4_4_ =
                 ObjectsContext::EndPDFStream
                           (this_00,(PDFStream *)primitivesWriter.mStreamForWriting);
            PVar2 = primitivesWriter;
            if (primitivesWriter.mStreamForWriting != (IByteWriter *)0x0) {
              PDFStream::~PDFStream((PDFStream *)primitivesWriter.mStreamForWriting);
              operator_delete(PVar2.mStreamForWriting,0xf0);
            }
            pageDictionaryObjectIt.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node._0_4_ = 0;
          }
          else {
            pTVar10 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar10,
                              "PDFModifiedPage::WritePage, failed to start content object %ld",
                              inObjectID);
            pageDictionaryObjectIt.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node._0_4_ = 2;
          }
        }
        else {
          copyingContext._4_4_ = ObjectsContext::StartNewIndirectObject(this_00,pageObjectID);
          if (copyingContext._4_4_ == eSuccess) {
            primitivesWriter.mStreamForWriting =
                 (IByteWriter *)
                 ObjectsContext::StartPDFStream(this_00,(DictionaryContext *)0x0,false);
            pIVar20 = PDFStream::GetWriteStream((PDFStream *)primitivesWriter.mStreamForWriting);
            PrimitiveObjectsWriter::SetStreamForWriting(&local_4a0,pIVar20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"q",&local_4c1);
            PrimitiveObjectsWriter::WriteKeyword(&local_4a0,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::allocator<char>::~allocator(&local_4c1);
            copyingContext._4_4_ =
                 ObjectsContext::EndPDFStream
                           (this_00,(PDFStream *)primitivesWriter.mStreamForWriting);
            PVar2 = primitivesWriter;
            if (primitivesWriter.mStreamForWriting != (IByteWriter *)0x0) {
              PDFStream::~PDFStream((PDFStream *)primitivesWriter.mStreamForWriting);
              operator_delete(PVar2.mStreamForWriting,0xf0);
            }
            if (copyingContext._4_4_ == eSuccess) goto LAB_00249ff2;
            pTVar10 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar10,
                              "PDFModifiedPage::WritePage, failed to end encapsulating stream %ld",
                              pageObjectID);
            pageDictionaryObjectIt.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node._0_4_ = 2;
          }
          else {
            pTVar10 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar10,
                              "PDFModifiedPage::WritePage, failed to start encapsulating object %ld"
                              ,pageObjectID);
            pageDictionaryObjectIt.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node._0_4_ = 2;
          }
        }
        PrimitiveObjectsWriter::~PrimitiveObjectsWriter(&local_4a0);
      }
      else if (formResourcesNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        copyingContext._4_4_ =
             ObjectsContext::StartModifiedIndirectObject(this_00,newResourcesIndirect);
        if (copyingContext._4_4_ == eSuccess) goto LAB_00249d0a;
        pTVar10 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar10,
                          "PDFModifiedPage::WritePage, failed to start modified resources object %ld"
                          ,newResourcesIndirect);
        pageDictionaryObjectIt.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node._0_4_ = 2;
      }
      else {
        copyingContext._4_4_ =
             ObjectsContext::StartNewIndirectObject
                       (this_00,(ObjectIDType)
                                formResourcesNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (copyingContext._4_4_ == eSuccess) {
LAB_00249d0a:
          pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                             ((PDFDocumentCopyingContext *)objectContext);
          pPVar16 = PDFParser::ParseNewObject(pPVar8,newResourcesIndirect);
          PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFDictionary> *)local_478,pPVar16);
          pPVar8 = PDFDocumentCopyingContext::GetSourceDocumentParser
                             ((PDFDocumentCopyingContext *)objectContext);
          pPVar9 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_478);
          WriteModifiedResourcesDict_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&newStream,this,pPVar8,pPVar9,this_00,
                     (PDFDocumentCopyingContext *)objectContext);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&newStream);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&newStream);
          ObjectsContext::EndIndirectObject(this_00);
          PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFDictionary> *)local_478);
          goto LAB_00249dfb;
        }
        pTVar10 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar10,
                          "PDFModifiedPage::WritePage, failed to start new resources object %ld",
                          formResourcesNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pageDictionaryObjectIt.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node._0_4_ = 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290);
    }
    else {
      pTVar10 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar10,
                        "PDFModifiedPage::WritePage, failed to start modified page object %ld",
                        pageDictionaryObject.super_RefCountPtr<PDFDictionary>.mValue);
      pageDictionaryObjectIt.
      super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
      .mCurrentPosition._M_node._0_4_ = 2;
    }
  }
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFDictionary> *)local_58);
  if (((int)pageDictionaryObjectIt.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node != 0) &&
     ((int)pageDictionaryObjectIt.
           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
           .mCurrentPosition._M_node == 1)) {
    return this_local._4_4_;
  }
LAB_0024a503:
  if (objectContext != (ObjectsContext *)0x0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext
              ((PDFDocumentCopyingContext *)objectContext);
    operator_delete(objectContext,0xd0);
  }
  return copyingContext._4_4_;
}

Assistant:

PDFHummus::EStatusCode PDFModifiedPage::WritePage()
{
	EStatusCode status = EndContentContext(); // just in case someone forgot to close the latest content context
	PDFDocumentCopyingContext* copyingContext = NULL;

	do {
		if (status != eSuccess || !mIsDirty) {
			break;
		}

		// allocate an object ID for the new contents stream (for placing the form)
		// we first create the modified page object, so that we can define a name for the new form xobject
		// that is unique
		ObjectsContext& objectContext = mWriter->GetObjectsContext();
		ObjectIDType newContentObjectID = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
		ObjectIDType newEncapsulatingObjectID = 0;


		// create a copying context, so we can copy the page dictionary, and modify its contents + resources dict
		copyingContext = mWriter->CreatePDFCopyingContextForModifiedFile();

		// get the page object
		ObjectIDType pageObjectID = copyingContext->GetSourceDocumentParser()->GetPageObjectID(mPageIndex);
		PDFObjectCastPtr<PDFDictionary> pageDictionaryObject = copyingContext->GetSourceDocumentParser()->ParsePage(mPageIndex);
		if (!pageDictionaryObject)
		    return eFailure;
		MapIterator<PDFNameToPDFObjectMap>  pageDictionaryObjectIt = pageDictionaryObject->GetIterator();

		// create modified page object
		status = objectContext.StartModifiedIndirectObject(pageObjectID);
		if(status != eSuccess) {
			TRACE_LOG1("PDFModifiedPage::WritePage, failed to start modified page object %ld", pageObjectID);
			break;
		}
		DictionaryContext* modifiedPageObject = mWriter->GetObjectsContext().StartDictionary();

		// copy all elements of the page to the new page object, but the "Contents", "Resources" and "Annots" elements
		while (pageDictionaryObjectIt.MoveNext())
		{
			if (pageDictionaryObjectIt.GetKey()->GetValue() != "Resources" &&
				pageDictionaryObjectIt.GetKey()->GetValue() != "Contents" &&
				pageDictionaryObjectIt.GetKey()->GetValue() != "Annots")
			{
				modifiedPageObject->WriteKey(pageDictionaryObjectIt.GetKey()->GetValue());
				copyingContext->CopyDirectObjectAsIs(pageDictionaryObjectIt.GetValue());
			}
		}

		// Write new annotations entry, joining existing annotations, and new ones (from links attaching or what not)
		if (pageDictionaryObject->Exists("Annots") || mWriter->GetDocumentContext().GetAnnotations().size() > 0)
		{
			modifiedPageObject->WriteKey("Annots");
			objectContext.StartArray();

			// write old annots, if any exist
			if(pageDictionaryObject->Exists("Annots")) {
				PDFObjectCastPtr<PDFArray> anArray(copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Annots"));
				SingleValueContainerIterator<PDFObjectVector> refs = anArray->GetIterator();
				while (refs.MoveNext())
					copyingContext->CopyDirectObjectAsIs(refs.GetItem());

			}

			// write new annots from links
			ObjectIDTypeSet& annotations = mWriter->GetDocumentContext().GetAnnotations();
			if (annotations.size() > 0)
			{
				ObjectIDTypeSet::iterator it = annotations.begin();
				for (; it != annotations.end(); ++it)
					objectContext.WriteNewIndirectObjectReference(*it);
			}
			annotations.clear();
			objectContext.EndArray(eTokenSeparatorEndLine);

		}

		// Write new contents entry, joining the existing contents with the new one. take care of various scenarios of the existing Contents
		modifiedPageObject->WriteKey("Contents");
		if (!pageDictionaryObject->Exists("Contents"))
		{	// no contents
			objectContext.WriteIndirectObjectReference(newContentObjectID);
		}
		else
		{
			objectContext.StartArray();
			if (mEnsureContentEncapsulation)
			{
				newEncapsulatingObjectID = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
				objectContext.WriteNewIndirectObjectReference(newEncapsulatingObjectID);
			}

			RefCountPtr<PDFObject> pageContent(copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Contents"));
			if (pageContent->GetType() == PDFObject::ePDFObjectStream)
			{
				// single content stream. must be a refrence which points to it
				PDFObjectCastPtr<PDFIndirectObjectReference> ref(pageDictionaryObject->QueryDirectObject("Contents"));
				objectContext.WriteIndirectObjectReference(ref->mObjectID, ref->mVersion);
			}
			else if (pageContent->GetType() == PDFObject::ePDFObjectArray)
			{
				PDFArray* anArray = (PDFArray*)pageContent.GetPtr();

				// multiple content streams
				SingleValueContainerIterator<PDFObjectVector> refs = anArray->GetIterator();
				PDFObjectCastPtr<PDFIndirectObjectReference> ref;
				while (refs.MoveNext())
				{
					ref = refs.GetItem();
					objectContext.WriteIndirectObjectReference(ref->mObjectID, ref->mVersion);
				}

			}
			else {
				// this basically means no content...or whatever. just ignore.
			}

			objectContext.WriteNewIndirectObjectReference(newContentObjectID);
			objectContext.EndArray();
			objectContext.EndLine();
		}

		// Write a new resource entry. copy all but the "XObject" entry, which needs to be modified. Just for kicks i'm keeping the original 
		// form (either direct dictionary, or indirect object)
		ObjectIDType resourcesIndirect = 0;
		ObjectIDType newResourcesIndirect = 0;
		vector<string> formResourcesNames;

		modifiedPageObject->WriteKey("Resources");
		if (!pageDictionaryObject->Exists("Resources"))
		{
			// check if there's inherited dict. if so - write directly as a modified version
			PDFObjectCastPtr<PDFDictionary> parentDict(
				pageDictionaryObject->Exists("Parent") ? 
					copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Parent"): 
					NULL);
			if(!parentDict) {
				formResourcesNames = WriteNewResourcesDictionary(objectContext);
			}
			else {
				PDFObjectCastPtr<PDFDictionary> inheritedResources = findInheritedResources(copyingContext->GetSourceDocumentParser(),parentDict.GetPtr());
				if(!inheritedResources) {
					formResourcesNames = WriteNewResourcesDictionary(objectContext);
				} else {
					formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), inheritedResources.GetPtr(), objectContext, copyingContext);
				}
			}
		}
		else
		{
			// resources may be direct, or indirect. if direct, write as is, adding the new form xobject, otherwise wait till page object ends and write then
			PDFObjectCastPtr<PDFIndirectObjectReference> resourceDictRef(pageDictionaryObject->QueryDirectObject("Resources"));
			if (!resourceDictRef)
			{
				PDFObjectCastPtr<PDFDictionary> resourceDict(pageDictionaryObject->QueryDirectObject("Resources"));
				formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), resourceDict.GetPtr(), objectContext, copyingContext);
			}
			else
			{
				resourcesIndirect = resourceDictRef->mObjectID;
				// later will write a modified version of the resources dictionary, with the new form.
				// only modify the resources dict object if wasn't already modified (can happen when sharing resources dict between multiple pages).
				// in the case where it was alrady modified, create a new resources dictionary that's a copy, and use it instead, to avoid overwriting
				// the previous modification
				GetObjectWriteInformationResult res = objectContext.GetInDirectObjectsRegistry().GetObjectWriteInformation(resourcesIndirect);
				if (res.first && res.second.mIsDirty)
				{
					newResourcesIndirect = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
					modifiedPageObject->WriteObjectReferenceValue(newResourcesIndirect);
				}
				else
					modifiedPageObject->WriteObjectReferenceValue(resourcesIndirect);
			}
		}

		objectContext.EndDictionary(modifiedPageObject);
		objectContext.EndIndirectObject();

		if (resourcesIndirect != 0)
		{
			if (newResourcesIndirect != 0) {
				status = objectContext.StartNewIndirectObject(newResourcesIndirect);
				if(status != eSuccess) {
					TRACE_LOG1("PDFModifiedPage::WritePage, failed to start new resources object %ld", newResourcesIndirect);
					break;
				}				
			} else {
				status = objectContext.StartModifiedIndirectObject(resourcesIndirect);
				if(status != eSuccess) {
					TRACE_LOG1("PDFModifiedPage::WritePage, failed to start modified resources object %ld", resourcesIndirect);
					break;
				}
			}


			PDFObjectCastPtr<PDFDictionary> resourceDict(copyingContext->GetSourceDocumentParser()->ParseNewObject(resourcesIndirect));
			formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), resourceDict.GetPtr(), objectContext, copyingContext);
			objectContext.EndIndirectObject();
		}

		// if required write encapsulation code, so that new stream is independent of graphic context of original
		PDFStream* newStream;
		PrimitiveObjectsWriter primitivesWriter;
		if (newEncapsulatingObjectID != 0)
		{
			status = objectContext.StartNewIndirectObject(newEncapsulatingObjectID);
			if(status != eSuccess) {
				TRACE_LOG1("PDFModifiedPage::WritePage, failed to start encapsulating object %ld", newEncapsulatingObjectID);
				break;
			}
			newStream = objectContext.StartPDFStream();
			primitivesWriter.SetStreamForWriting(newStream->GetWriteStream());
			primitivesWriter.WriteKeyword("q");
			status = objectContext.EndPDFStream(newStream);
			delete newStream;
			if(status != eSuccess) {
				TRACE_LOG1("PDFModifiedPage::WritePage, failed to end encapsulating stream %ld", newEncapsulatingObjectID);
				break;
			}
		}

		// last but not least, create the actual content stream object, placing the form
		status = objectContext.StartNewIndirectObject(newContentObjectID);
		if(status != eSuccess) {
			TRACE_LOG1("PDFModifiedPage::WritePage, failed to start content object %ld", newContentObjectID);
			break;
		}		
		newStream = objectContext.StartPDFStream();
		primitivesWriter.SetStreamForWriting(newStream->GetWriteStream());

		if (newEncapsulatingObjectID != 0) {
			primitivesWriter.WriteKeyword("Q");
		}

		vector<string>::iterator it = formResourcesNames.begin();
		for (; it != formResourcesNames.end(); ++it)
		{
			primitivesWriter.WriteKeyword("q");
			primitivesWriter.WriteInteger(1);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(1);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteKeyword("cm");
			primitivesWriter.WriteName(*it);
			primitivesWriter.WriteKeyword("Do");
			primitivesWriter.WriteKeyword("Q");
		}

		status = objectContext.EndPDFStream(newStream);

		delete newStream;
	} while (false);

	delete copyingContext;

	return status;
}